

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O2

int coda_path_find_file(char *searchpath,char *filename,char **location)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *__ptr;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  char *__s;
  char *__ptr_00;
  int local_c8;
  stat sb;
  
  sVar3 = strlen(filename);
  if ((searchpath == (char *)0x0) || (*searchpath == '\0')) {
    *location = (char *)0x0;
LAB_0015f524:
    iVar7 = 0;
  }
  else {
    __ptr = strdup(searchpath);
    if (__ptr == (char *)0x0) {
      iVar7 = -1;
      coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                     "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                     ,0x187);
    }
    else {
      iVar7 = 0;
      __s = __ptr;
      __ptr_00 = (char *)0x0;
      do {
        cVar1 = *__s;
        pcVar6 = __s;
        if (cVar1 == '\0') {
          free(__ptr_00);
          free(__ptr);
          *location = (char *)0x0;
          goto LAB_0015f524;
        }
        while (pcVar5 = pcVar6 + 1, cVar1 != '\0') {
          if (cVar1 == ':') {
            *pcVar6 = '\0';
            pcVar6 = pcVar5;
            break;
          }
          pcVar6 = pcVar5;
          cVar1 = *pcVar5;
        }
        sVar4 = strlen(__s);
        local_c8 = (int)sVar3;
        local_c8 = (int)sVar4 + local_c8;
        pcVar5 = __ptr_00;
        if (iVar7 <= local_c8) {
          pcVar5 = (char *)realloc(__ptr_00,(long)(local_c8 + 2));
          if (pcVar5 == (char *)0x0) {
            iVar7 = -1;
            coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                           "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-utils.c"
                           ,0x1a5);
            goto LAB_0015f5a6;
          }
          iVar7 = local_c8 + 1;
        }
        sprintf(pcVar5,"%s/%s",__s,filename);
        iVar2 = stat(pcVar5,(stat *)&sb);
        __s = pcVar6;
        __ptr_00 = pcVar5;
      } while ((iVar2 != 0) || ((sb.st_mode._1_1_ & 0x80) == 0));
      *location = pcVar5;
      iVar7 = 0;
      __ptr_00 = __ptr;
LAB_0015f5a6:
      free(__ptr_00);
    }
  }
  return iVar7;
}

Assistant:

int coda_path_find_file(const char *searchpath, const char *filename, char **location)
{
#ifdef WIN32
    const char path_separator_char = ';';
#else
    const char path_separator_char = ':';
#endif
    char *path;
    char *path_component;
    char *filepath = NULL;
    int filepath_length = 0;
    int filename_length = (int)strlen(filename);

    if (searchpath == NULL || searchpath[0] == '\0')
    {
        *location = NULL;
        return 0;
    }

    path = strdup(searchpath);
    if (path == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                       __LINE__);
        return -1;
    }
    path_component = path;
    while (*path_component != '\0')
    {
        struct stat sb;
        char *p;
        int path_component_length;

        p = path_component;
        while (*p != '\0' && *p != path_separator_char)
        {
            p++;
        }
        if (*p != '\0')
        {
            *p = '\0';
            p++;
        }

        path_component_length = (int)strlen(path_component);
        if (filepath_length < path_component_length + filename_length + 1)
        {
            char *new_filepath;

            new_filepath = realloc(filepath, path_component_length + filename_length + 2);
            if (new_filepath == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                               __LINE__);
                if (filepath != NULL)
                {
                    free(filepath);
                }
                return -1;
            }
            filepath = new_filepath;
            filepath_length = path_component_length + filename_length + 1;
        }
        sprintf(filepath, "%s/%s", path_component, filename);

        if (stat(filepath, &sb) == 0)
        {
            if (sb.st_mode & S_IFREG)
            {
                /* we found the file */
                *location = filepath;
                free(path);
                return 0;
            }
        }

        path_component = p;
    }

    if (filepath != NULL)
    {
        free(filepath);
    }
    free(path);

    /* the file was not found */
    *location = NULL;
    return 0;
}